

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

ssize_t __thiscall
Imf_3_2::anon_unknown_0::PtrIStream::read(PtrIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  void *pvVar2;
  ostream *poVar3;
  InputExc *pIVar4;
  ulong __n;
  undefined4 in_register_00000034;
  stringstream _iex_throw_s;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  __n = (ulong)__buf & 0xffffffff;
  if ((int)__buf < 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(asStack_1a8);
    poVar3 = (ostream *)std::ostream::operator<<(local_198,(int)__buf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bytes requested from stream",0x1c);
    pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar4,asStack_1a8);
    __cxa_throw(pIVar4,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  if (this->current + __n <= this->end) {
    pvVar2 = memcpy((void *)CONCAT44(in_register_00000034,__fd),this->current,__n);
    pcVar1 = this->current;
    this->current = pcVar1 + __n;
    return CONCAT71((int7)((ulong)pvVar2 >> 8),pcVar1 + __n != this->end);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Early end of file: requesting ",0x1e);
  poVar3 = std::ostream::_M_insert<long>((long)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," extra bytes after file\n",0x18);
  pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(pIVar4,asStack_1a8);
  __cxa_throw(pIVar4,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

virtual bool read (char c[/*n*/], int n)
    {
        if (n < 0)
        {
            THROW (
                IEX_NAMESPACE::InputExc, n << " bytes requested from stream");
        }

        if (n + current > end)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Early end of file: requesting "
                    << end - (n + current) << " extra bytes after file\n");
        }
        memcpy (c, current, n);
        current += n;

        return (current != end);
    }